

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O0

CollationCacheEntry *
icu_63::CollationLoader::makeCacheEntry
          (Locale *loc,CollationCacheEntry *entryFromCache,UErrorCode *errorCode)

{
  UBool UVar1;
  CollationCacheEntry *this;
  Locale *other;
  CollationCacheEntry *local_58;
  CollationCacheEntry *entry;
  UErrorCode *errorCode_local;
  CollationCacheEntry *entryFromCache_local;
  Locale *loc_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  loc_local = (Locale *)entryFromCache;
  if (UVar1 == '\0') {
    other = &entryFromCache->validLocale;
    UVar1 = Locale::operator==(loc,other);
    if (UVar1 == '\0') {
      this = (CollationCacheEntry *)UMemory::operator_new((UMemory *)0x100,(size_t)other);
      local_58 = (CollationCacheEntry *)0x0;
      if (this != (CollationCacheEntry *)0x0) {
        CollationCacheEntry::CollationCacheEntry(this,loc,entryFromCache->tailoring);
        local_58 = this;
      }
      if (local_58 == (CollationCacheEntry *)0x0) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
        SharedObject::removeRef(&entryFromCache->super_SharedObject);
        loc_local = (Locale *)0x0;
      }
      else {
        SharedObject::addRef(&local_58->super_SharedObject);
        SharedObject::removeRef(&entryFromCache->super_SharedObject);
        loc_local = (Locale *)local_58;
      }
    }
  }
  return (CollationCacheEntry *)loc_local;
}

Assistant:

const CollationCacheEntry *
CollationLoader::makeCacheEntry(
        const Locale &loc,
        const CollationCacheEntry *entryFromCache,
        UErrorCode &errorCode) {
    if(U_FAILURE(errorCode) || loc == entryFromCache->validLocale) {
        return entryFromCache;
    }
    CollationCacheEntry *entry = new CollationCacheEntry(loc, entryFromCache->tailoring);
    if(entry == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        entryFromCache->removeRef();
        return NULL;
    }
    entry->addRef();
    entryFromCache->removeRef();
    return entry;
}